

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

int __thiscall Fl_Text_Display::move_up(Fl_Text_Display *this)

{
  int iVar1;
  int rightClip;
  int iVar2;
  int iVar3;
  int in_R8D;
  int in_R9D;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  int local_24;
  
  iVar1 = position_to_line(this,this->mCursorPos,&local_24);
  if (iVar1 == 0) {
    iVar1 = line_start(this,this->mCursorPos);
    local_24 = -1;
  }
  else {
    iVar1 = this->mLineStarts[local_24];
  }
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    rightClip = this->mCursorPreferredXPos;
    if (rightClip < 0) {
      rightClip = handle_vline(this,3,iVar1,this->mCursorPos - iVar1,in_R8D,in_R9D,0,
                               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,0x7fffffff);
    }
    if (local_24 - 1U < 0xfffffffe) {
      iVar3 = this->mLineStarts[(long)local_24 + -1];
    }
    else {
      iVar3 = rewind_lines(this,iVar1,1);
    }
    iVar1 = 1;
    iVar2 = line_end(this,iVar3,true);
    iVar3 = handle_vline(this,2,iVar3,iVar2 - iVar3,in_R8D,in_R9D,0,in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffc8,rightClip);
    insert_position(this,iVar3);
    this->mCursorPreferredXPos = rightClip;
  }
  return iVar1;
}

Assistant:

int Fl_Text_Display::move_up() {
  int lineStartPos, xPos, prevLineStartPos, newPos, visLineNum;

  /* Find the position of the start of the line.  Use the line starts array
   if possible */
  if ( position_to_line( mCursorPos, &visLineNum ) )
    lineStartPos = mLineStarts[ visLineNum ];
  else {
    lineStartPos = line_start( mCursorPos );
    visLineNum = -1;
  }
  if ( lineStartPos == 0 )
    return 0;

  /* Decide what column to move to, if there's a preferred column use that */
  if (mCursorPreferredXPos >= 0)
    xPos = mCursorPreferredXPos;
  else
    xPos = handle_vline(GET_WIDTH, lineStartPos, mCursorPos-lineStartPos,
                        0, 0, 0, 0, 0, INT_MAX);

  /* count forward from the start of the previous line to reach the column */
  if ( visLineNum != -1 && visLineNum != 0 )
    prevLineStartPos = mLineStarts[ visLineNum - 1 ];
  else
    prevLineStartPos = rewind_lines( lineStartPos, 1 );

  int lineEnd = line_end(prevLineStartPos, true);
  newPos = handle_vline(FIND_INDEX_FROM_ZERO, prevLineStartPos, lineEnd-prevLineStartPos,
                        0, 0, 0, 0, 0, xPos);

  /* move the cursor */
  insert_position( newPos );

  /* if a preferred column wasn't aleady established, establish it */
  mCursorPreferredXPos = xPos;
  return 1;
}